

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# surface_count_quantity.cpp
# Opt level: O0

string * __thiscall
polyscope::SurfaceCountQuantity::getColorMap_abi_cxx11_(SurfaceCountQuantity *this)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar1;
  long in_RSI;
  string *in_RDI;
  
  pbVar1 = PersistentValue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           ::get((PersistentValue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)(in_RSI + 0x108));
  std::__cxx11::string::string((string *)in_RDI,(string *)pbVar1);
  return in_RDI;
}

Assistant:

std::string SurfaceCountQuantity::getColorMap() { return colorMap.get(); }